

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAlias.c
# Opt level: O2

void CmdCommandAliasAdd(Abc_Frame_t *pAbc,char *sName,int argc,char **argv)

{
  int iVar1;
  char *value;
  char *key;
  void *pvVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  value = (char *)malloc(0x18);
  key = Extra_UtilStrsav(sName);
  *(char **)value = key;
  *(int *)(value + 8) = argc;
  pvVar2 = malloc((long)argc * 8);
  *(void **)(value + 0x10) = pvVar2;
  uVar5 = 0;
  uVar4 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pcVar3 = Extra_UtilStrsav(argv[uVar5]);
    *(char **)((long)pvVar2 + uVar5 * 8) = pcVar3;
  }
  iVar1 = st__insert(pAbc->tAliases,key,value);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("!fStatus",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAlias.c"
                ,0x3a,"void CmdCommandAliasAdd(Abc_Frame_t *, char *, int, char **)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void CmdCommandAliasAdd( Abc_Frame_t * pAbc, char * sName, int argc, char ** argv )
{
    Abc_Alias * pAlias;
    int fStatus, i;

    pAlias = ABC_ALLOC(Abc_Alias, 1);
    pAlias->sName = Extra_UtilStrsav(sName);
    pAlias->argc = argc;
    pAlias->argv = ABC_ALLOC(char *, pAlias->argc);
    for(i = 0; i < argc; i++) 
        pAlias->argv[i] = Extra_UtilStrsav(argv[i]);
    fStatus = st__insert( pAbc->tAliases, pAlias->sName, (char *) pAlias );
    assert(!fStatus);  
}